

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

ArenaData ** __thiscall
DListBase<Memory::ArenaData*,RealCount>::
PrependNode<Memory::NoThrowHeapAllocator,Memory::ArenaData*>
          (DListBase<Memory::ArenaData*,RealCount> *this,NoThrowHeapAllocator *allocator,
          ArenaData *param1)

{
  long lVar1;
  NoThrowHeapAllocator *alloc;
  long *plVar2;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  local_40 = (undefined1  [8])&DListNode<Memory::ArenaData*>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_26dcec;
  data.filename._0_4_ = 0x117;
  alloc = Memory::NoThrowHeapAllocator::TrackAllocInfo(allocator,(TrackAllocData *)local_40);
  plVar2 = (long *)new<Memory::NoThrowHeapAllocator>(0x18,alloc,0x61b984);
  plVar2[2] = (long)param1;
  lVar1 = *(long *)this;
  plVar2[1] = *(long *)(lVar1 + 8);
  *plVar2 = lVar1;
  **(undefined8 **)(lVar1 + 8) = plVar2;
  *(long **)(lVar1 + 8) = plVar2;
  *(int *)(this + 0x10) = *(int *)(this + 0x10) + 1;
  return (ArenaData **)(plVar2 + 2);
}

Assistant:

TData * PrependNode(TAllocator * allocator, TParam1 param1)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, param1);
        if (newNode)
        {
            DListBase::InsertNodeBefore(this->Next(), newNode);
            this->IncrementCount();
            return &newNode->data;
        }
        return nullptr;
    }